

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> it,size_t n,fill_t<char> *fill)

{
  byte bVar1;
  __type _Var2;
  bool bVar3;
  
  bVar1 = fill->size_;
  if ((ulong)bVar1 == 1) {
    _Var2 = std::
            __fill_n_a1<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,unsigned_long,char>
                      (it,n,fill->data_);
    return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)_Var2.container;
  }
  while (bVar3 = n != 0, n = n - 1, bVar3) {
    it = std::
         copy_n<char_const*,unsigned_long,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                   (fill->data_,(ulong)bVar1,it);
  }
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)it.container;
}

Assistant:

FMT_NOINLINE OutputIt fill(OutputIt it, size_t n, const fill_t<Char>& fill) {
  auto fill_size = fill.size();
  if (fill_size == 1) return std::fill_n(it, n, fill[0]);
  for (size_t i = 0; i < n; ++i) it = std::copy_n(fill.data(), fill_size, it);
  return it;
}